

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O1

uint64_t helper_autdb_aarch64(CPUARMState_conflict *env,uint64_t x,uint64_t y)

{
  uint64_t uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uintptr_t unaff_retaddr;
  
  uVar3 = (uint)env->features;
  if ((uVar3 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar2 == 0x16) {
        uVar3 = 3;
      }
      else if (uVar2 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar4 = uVar2 == 0x16;
          if (!bVar4) {
            bVar4 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar3 >> 0x1c & 1) == 0) && (uVar3 = 3, bVar4)) goto LAB_0063144c;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0063144c:
  uVar1 = arm_sctlr_aarch64(env,uVar3);
  if (((uint)uVar1 >> 0xd & 1) != 0) {
    pauth_check_trap(env,uVar3,unaff_retaddr);
    uVar1 = pauth_auth(env,x,y,&(env->keys).apdb,true,1);
    return uVar1;
  }
  return x;
}

Assistant:

uint64_t HELPER(autdb)(CPUARMState *env, uint64_t x, uint64_t y)
{
    int el = arm_current_el(env);
    if (!pauth_key_enabled(env, el, SCTLR_EnDB)) {
        return x;
    }
    pauth_check_trap(env, el, GETPC());
    return pauth_auth(env, x, y, &env->keys.apdb, true, 1);
}